

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

ConstSchema __thiscall capnp::Schema::asConst(Schema *this)

{
  Schema SVar1;
  Fault f;
  ArrayPtr<const_char> local_68;
  WirePointer *local_58;
  int local_50;
  StructReader local_40;
  
  local_58 = (WirePointer *)this->raw->generic->encodedNode;
  local_68 = (ArrayPtr<const_char>)ZEXT816(0);
  local_50 = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_40,(PointerReader *)&local_68,(word *)0x0);
  if ((local_40.dataSize < 0x70) || (*(short *)((long)local_40.data + 0xc) != 4)) {
    local_58 = (WirePointer *)this->raw->generic->encodedNode;
    local_68 = (ArrayPtr<const_char>)ZEXT816(0);
    local_50 = 0x7fffffff;
    capnp::_::PointerReader::getStruct(&local_40,(PointerReader *)&local_68,(word *)0x0);
    local_68 = (ArrayPtr<const_char>)
               capnp::schema::Node::Reader::getDisplayName((Reader *)&local_40);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48],capnp::Text::Reader>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x125,FAILED,"getProto().isConst()",
               "\"Tried to use non-constant schema as a constant.\", getProto().getDisplayName()",
               (char (*) [48])"Tried to use non-constant schema as a constant.",(Reader *)&local_68)
    ;
    kj::_::Debug::Fault::~Fault(&f);
    SVar1.raw = (RawBrandedSchema *)(capnp::_::NULL_CONST_SCHEMA + 0x48);
  }
  else {
    SVar1 = (Schema)this->raw;
  }
  return (ConstSchema)SVar1.raw;
}

Assistant:

ConstSchema Schema::asConst() const {
  KJ_REQUIRE(getProto().isConst(), "Tried to use non-constant schema as a constant.",
             getProto().getDisplayName()) {
    return ConstSchema();
  }
  return ConstSchema(*this);
}